

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

self * __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::const_iterator::operator++(self *__return_storage_ptr__,const_iterator *this,int param_1)

{
  undefined6 uVar1;
  int param_1_local;
  const_iterator *this_local;
  
  __return_storage_ptr__->currnode = this->currnode;
  uVar1 = *(undefined6 *)&this->field_0xa;
  __return_storage_ptr__->currslot = this->currslot;
  *(undefined6 *)&__return_storage_ptr__->field_0xa = uVar1;
  (__return_storage_ptr__->temp_value).first = (this->temp_value).first;
  (__return_storage_ptr__->temp_value).second = (this->temp_value).second;
  if (this->currslot + 1 < (uint)(this->currnode->super_node).slotuse) {
    this->currslot = this->currslot + 1;
  }
  else if (this->currnode->nextleaf == (leaf_node *)0x0) {
    this->currslot = (this->currnode->super_node).slotuse;
  }
  else {
    this->currnode = this->currnode->nextleaf;
    this->currslot = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline self operator++(int)
            {
                self tmp = *this;   // copy ourselves

                if (currslot + 1 < currnode->slotuse) {
                    ++currslot;
                }
                else if (currnode->nextleaf != NULL) {
                    currnode = currnode->nextleaf;
                    currslot = 0;
                }
                else {
                    // this is end()
                    currslot = currnode->slotuse;
                }

                return tmp;
            }